

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3CodeDropTable(Parse *pParse,Table *pTab,int iDb,int isView)

{
  sqlite3 *db_00;
  Db *pDVar1;
  Vdbe *p;
  Db *pDb;
  Trigger *pTrigger;
  sqlite3 *db;
  Vdbe *v;
  int isView_local;
  int iDb_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  pDVar1 = db_00->aDb + iDb;
  p = sqlite3GetVdbe(pParse);
  sqlite3BeginWriteOperation(pParse,1,iDb);
  if (pTab->nModuleArg != 0) {
    sqlite3VdbeAddOp0(p,0x99);
  }
  for (pDb = (Db *)sqlite3TriggerList(pParse,pTab); pDb != (Db *)0x0; pDb = (Db *)pDb[2].zDbSName) {
    sqlite3DropTriggerPtr(pParse,(Trigger *)pDb);
  }
  if ((pTab->tabFlags & 8) != 0) {
    sqlite3NestedParse(pParse,"DELETE FROM %Q.sqlite_sequence WHERE name=%Q",pDVar1->zDbSName,
                       pTab->zName);
  }
  sqlite3NestedParse(pParse,"DELETE FROM %Q.%s WHERE tbl_name=%Q and type!=\'trigger\'",
                     pDVar1->zDbSName,"sqlite_master");
  if ((isView == 0) && (pTab->nModuleArg == 0)) {
    destroyTable(pParse,pTab);
  }
  if (pTab->nModuleArg != 0) {
    sqlite3VdbeAddOp4(p,0x9b,iDb,0,0,pTab->zName,0);
  }
  sqlite3VdbeAddOp4(p,0x8b,iDb,0,0,pTab->zName,0);
  sqlite3ChangeCookie(pParse,iDb);
  sqliteViewResetAll(db_00,iDb);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeDropTable(Parse *pParse, Table *pTab, int iDb, int isView){
  Vdbe *v;
  sqlite3 *db = pParse->db;
  Trigger *pTrigger;
  Db *pDb = &db->aDb[iDb];

  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );
  sqlite3BeginWriteOperation(pParse, 1, iDb);

#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTab) ){
    sqlite3VdbeAddOp0(v, OP_VBegin);
  }
#endif

  /* Drop all triggers associated with the table being dropped. Code
  ** is generated to remove entries from sqlite_master and/or
  ** sqlite_temp_master if required.
  */
  pTrigger = sqlite3TriggerList(pParse, pTab);
  while( pTrigger ){
    assert( pTrigger->pSchema==pTab->pSchema || 
        pTrigger->pSchema==db->aDb[1].pSchema );
    sqlite3DropTriggerPtr(pParse, pTrigger);
    pTrigger = pTrigger->pNext;
  }

#ifndef SQLITE_OMIT_AUTOINCREMENT
  /* Remove any entries of the sqlite_sequence table associated with
  ** the table being dropped. This is done before the table is dropped
  ** at the btree level, in case the sqlite_sequence table needs to
  ** move as a result of the drop (can happen in auto-vacuum mode).
  */
  if( pTab->tabFlags & TF_Autoincrement ){
    sqlite3NestedParse(pParse,
      "DELETE FROM %Q.sqlite_sequence WHERE name=%Q",
      pDb->zDbSName, pTab->zName
    );
  }
#endif

  /* Drop all SQLITE_MASTER table and index entries that refer to the
  ** table. The program name loops through the master table and deletes
  ** every row that refers to a table of the same name as the one being
  ** dropped. Triggers are handled separately because a trigger can be
  ** created in the temp database that refers to a table in another
  ** database.
  */
  sqlite3NestedParse(pParse, 
      "DELETE FROM %Q.%s WHERE tbl_name=%Q and type!='trigger'",
      pDb->zDbSName, MASTER_NAME, pTab->zName);
  if( !isView && !IsVirtual(pTab) ){
    destroyTable(pParse, pTab);
  }

  /* Remove the table entry from SQLite's internal schema and modify
  ** the schema cookie.
  */
  if( IsVirtual(pTab) ){
    sqlite3VdbeAddOp4(v, OP_VDestroy, iDb, 0, 0, pTab->zName, 0);
  }
  sqlite3VdbeAddOp4(v, OP_DropTable, iDb, 0, 0, pTab->zName, 0);
  sqlite3ChangeCookie(pParse, iDb);
  sqliteViewResetAll(db, iDb);
}